

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::Setup::InitializeRestParam
          (Setup *this,InterpreterStackFrame *newInstance,Var *dest)

{
  int iVar1;
  Var *ppvVar2;
  ArgSlot AVar3;
  ArgSlot AVar4;
  ScriptContext *pSVar5;
  Var pvVar6;
  SparseArraySegmentBase *seg;
  SparseArraySegment<void_*> *pSVar7;
  uint32 elementCount;
  Type *elements;
  JavascriptArray *array;
  int excess;
  Var *src;
  Var *dest_local;
  InterpreterStackFrame *newInstance_local;
  Setup *this_local;
  
  ppvVar2 = this->inParams;
  AVar3 = ParseableFunctionInfo::GetInParamsCount
                    (&this->executeFunction->super_ParseableFunctionInfo);
  iVar1 = this->inSlotsCount;
  AVar4 = ParseableFunctionInfo::GetInParamsCount
                    (&this->executeFunction->super_ParseableFunctionInfo);
  if ((int)(uint)AVar4 < iVar1) {
    iVar1 = this->inSlotsCount;
    AVar4 = ParseableFunctionInfo::GetInParamsCount
                      (&this->executeFunction->super_ParseableFunctionInfo);
    elementCount = iVar1 - (uint)AVar4;
    pSVar5 = FunctionProxy::GetScriptContext((FunctionProxy *)this->executeFunction);
    pvVar6 = Js::JavascriptArray::OP_NewScArray(elementCount,pSVar5);
    *dest = pvVar6;
    seg = Js::JavascriptArray::GetHead((JavascriptArray *)*dest);
    pSVar7 = SparseArraySegment<void_*>::From(seg);
    Memory::CopyArray<void,Memory::WriteBarrierPtr<void>,Memory::Recycler>
              ((WriteBarrierPtr<void> *)(pSVar7 + 1),(long)(int)elementCount,
               ppvVar2 + (int)(uint)AVar3,(long)(int)elementCount);
  }
  else {
    pSVar5 = FunctionProxy::GetScriptContext((FunctionProxy *)this->executeFunction);
    pvVar6 = Js::JavascriptArray::OP_NewScArray(0,pSVar5);
    *dest = pvVar6;
  }
  return;
}

Assistant:

void InterpreterStackFrame::Setup::InitializeRestParam(InterpreterStackFrame * newInstance, Var *dest)
    {
        Var *src = this->inParams + executeFunction->GetInParamsCount();

        if (this->inSlotsCount > executeFunction->GetInParamsCount())
        {
            // Create the rest array and copy the args directly into the contiguous head segment.
            int excess = this->inSlotsCount - executeFunction->GetInParamsCount();
            *dest = JavascriptArray::OP_NewScArray(excess, executeFunction->GetScriptContext());
            JavascriptArray *array = static_cast<JavascriptArray *>(*dest);
            Field(Var)* elements = SparseArraySegment<Var>::From(array->GetHead())->elements;
            CopyArray(elements, excess, src, excess);
        }
        else
        {
            // Rest is an empty array when there are no excess parameters.
            *dest = JavascriptArray::OP_NewScArray(0, executeFunction->GetScriptContext());
        }
    }